

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45a12::MapDrivePlugIn::drawPathFencesOnMap
          (MapDrivePlugIn *this,TerrainMap *map,GCRoute *path)

{
  long in_RSI;
  Vec3 VVar1;
  float wallThickness;
  float outside;
  int i;
  int j;
  Vec3 g;
  Vec3 nextRow;
  Vec3 alongRow;
  float zs;
  float xs;
  float local_88;
  float in_stack_ffffffffffffff84;
  bool value;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  PolylineSegmentedPathwaySegmentRadii *pathway;
  Vec3 local_70;
  float fStack_68;
  float in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  int iVar2;
  int local_48;
  Vec3 local_44;
  Vec3 local_38;
  Vec3 local_2c;
  float local_20;
  float local_1c;
  long local_10;
  
  local_1c = *(float *)(in_RSI + 0xc) / (float)*(int *)(in_RSI + 0x14);
  local_20 = *(float *)(in_RSI + 0x10) / (float)*(int *)(in_RSI + 0x14);
  local_10 = in_RSI;
  OpenSteer::Vec3::Vec3(&local_2c,local_1c,0.0,0.0);
  OpenSteer::Vec3::Vec3(&local_38,-*(float *)(local_10 + 0xc),0.0,local_20);
  OpenSteer::Vec3::Vec3
            (&local_44,(*(float *)(local_10 + 0xc) - local_1c) / -2.0,0.0,
             (*(float *)(local_10 + 0x10) - local_20) / -2.0);
  for (local_48 = 0; local_48 < *(int *)(local_10 + 0x14); local_48 = local_48 + 1) {
    for (iVar2 = 0; iVar2 < *(int *)(local_10 + 0x14); iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffffb0 =
           mapPointToOutside(pathway,(Vec3 *)CONCAT44(in_stack_ffffffffffffff8c,
                                                      in_stack_ffffffffffffff88));
      in_stack_ffffffffffffffac = 0x3f800000;
      value = SUB41((uint)in_stack_ffffffffffffff84 >> 0x18,0);
      if ((0.0 < in_stack_ffffffffffffffb0) && (in_stack_ffffffffffffffb0 < 1.0)) {
        TerrainMap::setMapBit
                  ((TerrainMap *)pathway,(int)in_stack_ffffffffffffff8c,
                   (int)in_stack_ffffffffffffff88,value);
      }
      if (1.0 < in_stack_ffffffffffffffb0) {
        TerrainMap::setMapBit
                  ((TerrainMap *)pathway,(int)in_stack_ffffffffffffff8c,
                   (int)in_stack_ffffffffffffff88,value);
      }
      local_70 = OpenSteer::Vec3::operator+=
                           ((Vec3 *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                            (Vec3 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffa8 = fStack_68;
    }
    VVar1 = OpenSteer::Vec3::operator+=
                      ((Vec3 *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                       (Vec3 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffff84 = VVar1.x;
    in_stack_ffffffffffffff88 = VVar1.y;
    local_88 = VVar1.z;
    in_stack_ffffffffffffff8c = local_88;
  }
  return;
}

Assistant:

void drawPathFencesOnMap (TerrainMap& map, GCRoute& path)
        {
    #ifdef OLDTERRAINMAP
            const float xs = map.xSize / (float)map.resolution;
            const float zs = map.zSize / (float)map.resolution;
            const Vec3 alongRow (xs, 0, 0);
            const Vec3 nextRow (-map.xSize, 0, zs);
            Vec3 g ((map.xSize - xs) / -2, 0, (map.zSize - zs) / -2);
            for (int j = 0; j < map.resolution; j++)
            {
                for (int i = 0; i < map.resolution; i++)
                {
                    const float outside = mapPointToOutside( path, g ); // path.howFarOutsidePath (g);
                    const float wallThickness = 1.0f;

                    // set map cells adjacent to the outside edge of the path
                    if ((outside > 0) && (outside < wallThickness))
                        map.setMapBit (i, j, true);

                    // clear all other off-path map cells 
                    if (outside > wallThickness) map.setMapBit (i, j, false);

                    g += alongRow;
                }
                g += nextRow;
            }
    #else
    #endif
        }